

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O3

void hollow_out_room(chunk *c,loc_conflict grid)

{
  loc grid_00;
  square *psVar1;
  wchar_t *pwVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    grid_00 = (loc)loc_sum(grid,(loc_conflict)ddgrid_ddd[lVar3]);
    psVar1 = square((chunk_conflict *)c,grid_00);
    pwVar2 = &FEAT_FLOOR;
    if (FEAT_MAGMA == (uint)psVar1->feat) {
LAB_001589ea:
      square_set_feat((chunk_conflict *)c,grid_00,*pwVar2);
      hollow_out_room(c,(loc_conflict)grid_00);
    }
    else {
      psVar1 = square((chunk_conflict *)c,grid_00);
      pwVar2 = &FEAT_BROKEN;
      if (FEAT_OPEN == (uint)psVar1->feat) goto LAB_001589ea;
    }
    lVar3 = lVar3 + 1;
    if (lVar3 == 9) {
      return;
    }
  } while( true );
}

Assistant:

static void hollow_out_room(struct chunk *c, struct loc grid)
{
	int d;

	for (d = 0; d < 9; d++) {
		/* Extract adjacent location */
		struct loc grid1 = loc_sum(grid, ddgrid_ddd[d]);

		/* Change magma to floor. */
		if (square(c, grid1)->feat == FEAT_MAGMA) {
			square_set_feat(c, grid1, FEAT_FLOOR);

			/* Hollow out the room. */
			hollow_out_room(c, grid1);
		}
		/* Change open door to broken door. */
		else if (square(c, grid1)->feat == FEAT_OPEN) {
			square_set_feat(c, grid1, FEAT_BROKEN);

			/* Hollow out the (new) room. */
			hollow_out_room(c, grid1);
		}
	}
}